

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fission.cpp
# Opt level: O2

bool __thiscall spvtools::opt::LoopFissionImpl::CanPerformSplit(LoopFissionImpl *this)

{
  IRContext *context;
  ulong uVar1;
  IntrusiveNodeBase<spvtools::opt::Instruction> *pIVar2;
  pointer ppIVar3;
  bool bVar4;
  Loop **ppLVar5;
  _Base_ptr p_Var6;
  mapped_type_conflict *pmVar7;
  LoopFissionImpl *pLVar8;
  DistanceEntry *entry;
  Instruction *pIVar9;
  set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *__range2;
  map<spvtools::opt::Instruction_*,_unsigned_long,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
  *this_00;
  undefined1 auVar10 [8];
  LoopFissionImpl *pLVar11;
  LoopFissionImpl *pLVar12;
  Instruction *store;
  Instruction *inst_1;
  Instruction *inst;
  vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_> loops;
  LoopDependenceAnalysis analysis;
  Instruction *local_1c8;
  Instruction *local_1c0;
  _Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
  local_1b8;
  size_t local_1a0;
  Loop *local_198;
  LoopFissionImpl *local_190;
  undefined1 local_188 [8];
  pointer ppIStack_180;
  _Base_ptr local_178;
  undefined1 local_168 [8];
  _Base_ptr p_Stack_160;
  _Base_ptr local_158;
  _Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_> local_148;
  _Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_> local_130;
  LoopDependenceAnalysis local_118;
  
  if (this->load_used_in_condition_ != false) {
    return false;
  }
  local_148._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppLVar5 = &this->loop_;
  while (local_198 = *ppLVar5, local_198 != (Loop *)0x0) {
    std::vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>::
    push_back((vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_> *)
              &local_148,&local_198);
    ppLVar5 = &local_198->parent_;
  }
  context = this->context_;
  std::vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>::vector
            ((vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_> *)
             &local_130,
             (vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_> *)
             &local_148);
  LoopDependenceAnalysis::LoopDependenceAnalysis
            (&local_118,context,
             (vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_> *)
             &local_130);
  std::_Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>::
  ~_Vector_base(&local_130);
  local_168 = (undefined1  [8])0x0;
  p_Stack_160 = (_Base_ptr)0x0;
  local_158 = (_Base_ptr)0x0;
  local_178 = (_Base_ptr)0x0;
  local_188 = (undefined1  [8])0x0;
  ppIStack_180 = (pointer)0x0;
  for (p_Var6 = (this->cloned_loop_instructions_)._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left;
      (_Rb_tree_header *)p_Var6 !=
      &(this->cloned_loop_instructions_)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    local_1b8._M_impl.super__Vector_impl_data._M_start = *(pointer *)(p_Var6 + 1);
    pLVar11 = (LoopFissionImpl *)local_168;
    if ((((Instruction *)local_1b8._M_impl.super__Vector_impl_data._M_start)->opcode_ == OpStore) ||
       (pLVar11 = (LoopFissionImpl *)local_188, pLVar12 = (LoopFissionImpl *)local_168,
       ((Instruction *)local_1b8._M_impl.super__Vector_impl_data._M_start)->opcode_ == OpLoad)) {
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      push_back((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 *)pLVar11,(value_type *)&local_1b8);
      pLVar12 = pLVar11;
    }
    bVar4 = MovableInstruction(pLVar12,(Instruction *)
                                       local_1b8._M_impl.super__Vector_impl_data._M_start);
    if (!bVar4) goto LAB_00211599;
  }
  pLVar11 = (LoopFissionImpl *)this->loop_;
  local_1a0 = Loop::GetDepth((Loop *)pLVar11);
  local_190 = (LoopFissionImpl *)
              &(this->original_loop_instructions_)._M_t._M_impl.super__Rb_tree_header;
  this_00 = &this->instruction_order_;
  pLVar12 = (LoopFissionImpl *)
            (this->original_loop_instructions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
  ;
  while (pLVar12 != local_190) {
    local_1c0 = (Instruction *)
                (pLVar12->cloned_loop_instructions_)._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_right;
    bVar4 = MovableInstruction(pLVar11,local_1c0);
    p_Var6 = p_Stack_160;
    ppIVar3 = ppIStack_180;
    if (!bVar4) goto LAB_00211599;
    auVar10 = local_188;
    if (local_1c0->opcode_ == OpStore) {
      for (; auVar10 != (undefined1  [8])ppIVar3; auVar10 = (undefined1  [8])((long)auVar10 + 8)) {
        local_1c8 = *(Instruction **)auVar10;
        DistanceVector::DistanceVector((DistanceVector *)&local_1b8,local_1a0);
        pmVar7 = std::
                 map<spvtools::opt::Instruction_*,_unsigned_long,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
                 ::operator[](this_00,&local_1c8);
        uVar1 = *pmVar7;
        pmVar7 = std::
                 map<spvtools::opt::Instruction_*,_unsigned_long,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
                 ::operator[](this_00,&local_1c0);
        if (*pmVar7 < uVar1) goto LAB_0021158f;
        bVar4 = LoopDependenceAnalysis::GetDependence
                          (&local_118,local_1c0,local_1c8,(DistanceVector *)&local_1b8);
        pIVar9 = (Instruction *)local_1b8._M_impl.super__Vector_impl_data._M_start;
        if (!bVar4) {
          while (pIVar9 != (Instruction *)local_1b8._M_impl.super__Vector_impl_data._M_finish) {
            pIVar2 = &pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>;
            pIVar9 = (Instruction *)&pIVar9->opcode_;
            if ((long)pIVar2->next_node_ < 0) goto LAB_0021158f;
          }
        }
        std::
        _Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>::
        ~_Vector_base(&local_1b8);
      }
    }
    else {
      auVar10 = local_168;
      if (local_1c0->opcode_ == OpLoad) {
        for (; auVar10 != (undefined1  [8])p_Var6;
            auVar10 = (undefined1  [8])&((_Base_ptr)auVar10)->_M_parent) {
          local_1c8 = *(Instruction **)auVar10;
          DistanceVector::DistanceVector((DistanceVector *)&local_1b8,local_1a0);
          pmVar7 = std::
                   map<spvtools::opt::Instruction_*,_unsigned_long,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
                   ::operator[](this_00,&local_1c8);
          uVar1 = *pmVar7;
          pmVar7 = std::
                   map<spvtools::opt::Instruction_*,_unsigned_long,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
                   ::operator[](this_00,&local_1c0);
          if (*pmVar7 < uVar1) goto LAB_0021158f;
          bVar4 = LoopDependenceAnalysis::GetDependence
                            (&local_118,local_1c8,local_1c0,(DistanceVector *)&local_1b8);
          pIVar9 = (Instruction *)local_1b8._M_impl.super__Vector_impl_data._M_start;
          if (!bVar4) {
            while (pIVar9 != (Instruction *)local_1b8._M_impl.super__Vector_impl_data._M_finish) {
              pIVar2 = &pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>;
              pIVar9 = (Instruction *)&pIVar9->opcode_;
              if (0 < (long)pIVar2->next_node_) goto LAB_0021158f;
            }
          }
          std::
          _Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
          ::~_Vector_base(&local_1b8);
        }
      }
    }
    pLVar8 = (LoopFissionImpl *)std::_Rb_tree_increment((_Rb_tree_node_base *)pLVar12);
    pLVar11 = pLVar12;
    pLVar12 = pLVar8;
  }
  bVar4 = true;
LAB_0021159b:
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base((_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 *)local_188);
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base((_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 *)local_168);
  LoopDependenceAnalysis::~LoopDependenceAnalysis(&local_118);
  std::_Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>::
  ~_Vector_base(&local_148);
  return bVar4;
LAB_0021158f:
  std::_Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>::
  ~_Vector_base(&local_1b8);
LAB_00211599:
  bVar4 = false;
  goto LAB_0021159b;
}

Assistant:

bool LoopFissionImpl::CanPerformSplit() {
  // Return false if any of the condition instructions in the loop depend on a
  // load.
  if (load_used_in_condition_) {
    return false;
  }

  // Build a list of all parent loops of this loop. Loop dependence analysis
  // needs this structure.
  std::vector<const Loop*> loops;
  Loop* parent_loop = loop_;
  while (parent_loop) {
    loops.push_back(parent_loop);
    parent_loop = parent_loop->GetParent();
  }

  LoopDependenceAnalysis analysis{context_, loops};

  // A list of all the stores in the cloned loop.
  std::vector<Instruction*> set_one_stores{};

  // A list of all the loads in the cloned loop.
  std::vector<Instruction*> set_one_loads{};

  // Populate the above lists.
  for (Instruction* inst : cloned_loop_instructions_) {
    if (inst->opcode() == spv::Op::OpStore) {
      set_one_stores.push_back(inst);
    } else if (inst->opcode() == spv::Op::OpLoad) {
      set_one_loads.push_back(inst);
    }

    // If we find any instruction which we can't move (such as a barrier),
    // return false.
    if (!MovableInstruction(*inst)) return false;
  }

  // We need to calculate the depth of the loop to create the loop dependency
  // distance vectors.
  const size_t loop_depth = loop_->GetDepth();

  // Check the dependencies between loads in the cloned loop and stores in the
  // original and vice versa.
  for (Instruction* inst : original_loop_instructions_) {
    // If we find any instruction which we can't move (such as a barrier),
    // return false.
    if (!MovableInstruction(*inst)) return false;

    // Look at the dependency between the loads in the original and stores in
    // the cloned loops.
    if (inst->opcode() == spv::Op::OpLoad) {
      for (Instruction* store : set_one_stores) {
        DistanceVector vec{loop_depth};

        // If the store actually should appear after the load, return false.
        // This means the store has been placed in the wrong grouping.
        if (instruction_order_[store] > instruction_order_[inst]) {
          return false;
        }
        // If not independent check the distance vector.
        if (!analysis.GetDependence(store, inst, &vec)) {
          for (DistanceEntry& entry : vec.GetEntries()) {
            // A distance greater than zero means that the store in the cloned
            // loop has a dependency on the load in the original loop.
            if (entry.distance > 0) return false;
          }
        }
      }
    } else if (inst->opcode() == spv::Op::OpStore) {
      for (Instruction* load : set_one_loads) {
        DistanceVector vec{loop_depth};

        // If the load actually should appear after the store, return false.
        if (instruction_order_[load] > instruction_order_[inst]) {
          return false;
        }

        // If not independent check the distance vector.
        if (!analysis.GetDependence(inst, load, &vec)) {
          for (DistanceEntry& entry : vec.GetEntries()) {
            // A distance less than zero means the load in the cloned loop is
            // dependent on the store instruction in the original loop.
            if (entry.distance < 0) return false;
          }
        }
      }
    }
  }
  return true;
}